

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O2

void __thiscall VehicleState::Propagator::Propagate(Propagator *this,double dt,bool intSTM)

{
  double start_time;
  value_type rel_error;
  value_type abs_error;
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  *stepper;
  pointer pdVar1;
  undefined7 in_register_00000031;
  long lVar2;
  double end_time;
  state_type xint;
  MatrixXd STM;
  VectorXd eigcol;
  vector<double,_std::allocator<double>_> col;
  _Vector_base<double,_std::allocator<double>_> local_3b8;
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  local_3a0;
  Propagator local_2d0;
  type local_198;
  
  this->intSTM_ = intSTM;
  xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000031,intSTM) == 0) {
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._0_1_ = 0;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_resizer.m_initialized = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_first_call = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._3_5_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&xint,6,(value_type_conflict2 *)&local_3a0);
    *xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[4] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[5] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
  }
  else {
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._0_1_ = 0;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_resizer.m_initialized = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_first_call = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._3_5_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&xint,0x2a,(value_type_conflict2 *)&local_3a0);
    *xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[4] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[5] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[6] = 1.0;
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0xd] = 1.0;
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x14] = 1.0;
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x1b] = 1.0;
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x22] = 1.0;
    xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x29] = 1.0;
  }
  start_time = this->t_;
  rel_error = this->reltol_;
  abs_error = this->abstol_;
  local_3a0.
  super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ._1_2_ = 0x100;
  memset(&local_3a0.
          super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
          .m_dxdt,0,0xc2);
  boost::numeric::odeint::
  make_controlled<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,std::allocator<double>>,double,std::vector<double,std::allocator<double>>,double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations,boost::numeric::odeint::initially_resizer>>
            (&local_198,(odeint *)&local_3a0,abs_error,rel_error,stepper);
  Propagator(&local_2d0,this);
  end_time = dt + start_time;
  boost::numeric::odeint::
  integrate_adaptive<boost::numeric::odeint::controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,std::allocator<double>>,double,std::vector<double,std::allocator<double>>,double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations,boost::numeric::odeint::initially_resizer>,boost::numeric::odeint::default_error_checker<double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations>,boost::numeric::odeint::default_step_adjuster<double,double>,boost::numeric::odeint::initially_resizer,boost::numeric::odeint::explicit_error_stepper_fsal_tag>,VehicleState::Propagator,std::vector<double,std::allocator<double>>,double>
            (&local_198,&local_2d0,&xint,start_time,end_time,this->dt_var_);
  free(local_2d0.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  boost::numeric::odeint::
  controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_boost::numeric::odeint::default_error_checker<double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations>,_boost::numeric::odeint::default_step_adjuster<double,_double>,_boost::numeric::odeint::initially_resizer,_boost::numeric::odeint::explicit_error_stepper_fsal_tag>
  ::~controlled_runge_kutta(&local_198);
  boost::numeric::odeint::
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ::~runge_kutta_dopri5(&local_3a0);
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = *xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[1];
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[2];
  (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[3];
  (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[4];
  (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[5];
  this->t_ = end_time;
  if (intSTM) {
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._0_8_ = (double *)0x6;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x6;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&STM,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_3a0);
    lVar2 = 0x30;
    for (pdVar1 = (pointer)0x0; pdVar1 != (pointer)0x6; pdVar1 = (pointer)((long)pdVar1 + 1)) {
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      ._0_1_ = 0;
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      .m_resizer.m_initialized = false;
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      .m_first_call = false;
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      ._3_5_ = 0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &col.super__Vector_base<double,_std::allocator<double>_>,6,
                 (value_type_conflict2 *)&local_3a0,(allocator_type *)&eigcol);
      *col.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = *(double *)
                   ((long)xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar2);
      col.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = *(double *)
                     ((long)xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar2 + 8);
      col.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = *(double *)
                     ((long)xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar2 + 0x10);
      col.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = *(double *)
                     ((long)xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar2 + 0x18);
      col.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[4] = *(double *)
                     ((long)xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar2 + 0x20);
      col.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[5] = *(double *)
                     ((long)xint.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar2 + 0x28);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_3b8,
                 (vector<double,_std::allocator<double>_> *)
                 &col.super__Vector_base<double,_std::allocator<double>_>);
      Util::StdVec2Eigen((Util *)&eigcol,(vector<double,_std::allocator<double>_> *)&local_3b8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3b8);
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      ._0_8_ = STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
               + STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows * (long)pdVar1;
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x6;
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x1;
      local_3a0.
      super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
      .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&STM;
      local_3a0.m_x_tmp.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a0.m_x_tmp.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows;
      local_3a0.m_x_tmp.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_3a0,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&eigcol);
      free(eigcol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&col.super__Vector_base<double,_std::allocator<double>_>);
      lVar2 = lVar2 + 0x30;
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->STM_,&STM);
    free(STM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xint.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Propagator::Propagate(double dt, bool intSTM){

		//set flag
		this->intSTM_ = intSTM;

		//build state
		state_type xint;
		if (intSTM) {
			xint.assign(42,0.0);
			xint[0] = this->pos_[0];
			xint[1] = this->pos_[1];
			xint[2] = this->pos_[2];
			xint[3] = this->vel_[0];
			xint[4] = this->vel_[1];
			xint[5] = this->vel_[2];

			//stm initialization
			xint[6] = 1.0;
			xint[13] = 1.0;
			xint[20] = 1.0;
			xint[27] = 1.0;
			xint[34] = 1.0;
			xint[41] = 1.0;

		} else {
			xint.assign(6,0.0);
			xint[0] = this->pos_[0];
			xint[1] = this->pos_[1];
			xint[2] = this->pos_[2];
			xint[3] = this->vel_[0];
			xint[4] = this->vel_[1];
			xint[5] = this->vel_[2];
		} //fi

		// std::cout << "before: " << this->pos_ << std::endl;

		//times
		double t1 = this->t_;
		double t2 = t1 + dt;

		//call integrator
		ode::integrate_adaptive( ode::make_controlled( this->abstol_ , this->reltol_ ,
			error_stepper_type() ) , *this , xint , t1 , t2 , this->dt_var_ );

		//update class members
		this->pos_[0] = xint[0];
		this->pos_[1] = xint[1];
		this->pos_[2] = xint[2];
		this->vel_[0] = xint[3];
		this->vel_[1] = xint[4];
		this->vel_[2] = xint[5];
		this->t_ = t2;

		//if we propagated the STM, write it out
		if(intSTM){
			Eigen::MatrixXd STM = Eigen::MatrixXd::Zero(6,6);

			for (int ii = 0; ii < 6; ++ii) {
				std::vector<double> col(6,0);
				col[0] = xint[6*ii + 0 + 6];
				col[1] = xint[6*ii + 1 + 6];
				col[2] = xint[6*ii + 2 + 6];
				col[3] = xint[6*ii + 3 + 6];
				col[4] = xint[6*ii + 4 + 6];
				col[5] = xint[6*ii + 5 + 6];

				//convert to eigen
				Eigen::VectorXd eigcol = Util::StdVec2Eigen(col);

				//assign
				STM.block(0,ii,6,1) = eigcol;

			} // for

			//update
			this->STM_ = STM;

		} //fi

		// std::cout << "after: "<< this->pos_ << std::endl;

	}